

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op.h
# Opt level: O3

Variable<double> * yyml::nn::MM<double>(Variable<double> *va,Variable<double> *vb)

{
  Variable<double> *result;
  initializer_list<unsigned_long> __l;
  TensorShape shape;
  allocator_type local_51;
  TensorShape local_50;
  unsigned_long local_28;
  unsigned_long local_20;
  
  local_28 = *(va->values_).shape_.dims.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start;
  local_20 = (vb->values_).shape_.dims.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start[1];
  local_50.dim = 2;
  local_50.total = (size_t)((int)local_28 * (int)local_20);
  __l._M_len = 2;
  __l._M_array = &local_28;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_50.dims,__l,&local_51);
  result = Factory<yyml::nn::Variable<double>>::GetNewInstance<yyml::TensorShape&>(&local_50);
  MM<double>(va,vb,result);
  if (local_50.dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_50.dims.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.dims.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return result;
}

Assistant:

Variable<Type>* MM(Variable<Type>* va, Variable<Type>* vb) {
  size_t m = va->values_.shape().dims[0], n = vb->values_.shape().dims[1],
         p = va->values_.shape().dims[1];
  TensorShape shape = {m, n};
  auto* result = Variable<Type>::factory::GetNewInstance(shape);
  MM(va, vb, result);
  return result;
}